

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  unsigned_short uVar3;
  uint uVar4;
  ostream *poVar5;
  exception *ex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_88;
  undefined1 local_70 [8];
  file_opener out;
  undefined1 local_50 [8];
  user_options opt;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  opt.maximum._4_4_ = 0;
  user_options::get((user_options *)local_50,argc,argv);
  anon_unknown.dwarf_7c34::file_opener::file_opener((file_opener *)local_70,(string *)local_50);
  uVar1 = opt._32_8_;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  uVar2 = opt._32_8_;
  if ((ulong)uVar3 < (ulong)uVar1) {
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if ((ulong)uVar4 < (ulong)uVar2) {
      anon_unknown.dwarf_7c34::sieve<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ex,opt._32_8_);
      poVar5 = anon_unknown.dwarf_7c34::file_opener::get_stream((file_opener *)local_70);
      write_output<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ex,opt._24_4_,poVar5);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&ex);
    }
    else {
      anon_unknown.dwarf_7c34::sieve<unsigned_int>(&local_a0,opt._32_8_);
      poVar5 = anon_unknown.dwarf_7c34::file_opener::get_stream((file_opener *)local_70);
      write_output<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                (&local_a0,opt._24_4_,poVar5);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
    }
  }
  else {
    anon_unknown.dwarf_7c34::sieve<unsigned_short>(&local_88,opt._32_8_);
    poVar5 = anon_unknown.dwarf_7c34::file_opener::get_stream((file_opener *)local_70);
    write_output<std::vector<unsigned_short,std::allocator<unsigned_short>>>
              (&local_88,opt._24_4_,poVar5);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_88);
  }
  anon_unknown.dwarf_7c34::file_opener::~file_opener((file_opener *)local_70);
  user_options::~user_options((user_options *)local_50);
  return opt.maximum._4_4_;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        user_options const opt = user_options::get (argc, argv);

        file_opener const out{opt.output};
        if (opt.maximum <= std::numeric_limits<std::uint16_t>::max ()) {
            write_output (sieve<std::uint16_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else if (opt.maximum <= std::numeric_limits<std::uint32_t>::max ()) {
            write_output (sieve<std::uint32_t> (opt.maximum), opt.endianness, out.get_stream ());
        } else {
            write_output (sieve<std::uint64_t> (opt.maximum), opt.endianness, out.get_stream ());
        }
    }